

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
          (FactoredDecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  *(undefined8 *)&this->field_0x708 = 0x5e16b8;
  *(undefined8 *)&this->field_0x710 = 0x5e1a20;
  MultiAgentDecisionProcessDiscreteFactoredStates::MultiAgentDecisionProcessDiscreteFactoredStates
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,
             &PTR_construction_vtable_80__005e0968,name,descr,pf);
  DecPOMDP::DecPOMDP((DecPOMDP *)
                     &(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600,
                     &PTR_PTR_005e0998);
  *(undefined8 *)
   &(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).super_MultiAgentDecisionProcess =
       0x5dfe18;
  *(undefined8 *)&this->field_0x708 = 0x5e03e0;
  *(undefined8 *)&this->field_0x710 = 0x5e0748;
  *(undefined8 *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600 =
       0x5e01e0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_sfScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_agScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_LRFs).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FactoredQFunctionScopeForStage::FactoredQFunctionScopeForStage(&this->_m_immRewScope);
  *(undefined8 *)
   ((long)&(this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrSFVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->_m_nrActionVals).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&this->_m_p_rModel + 2) = 0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrXIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrAIs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrSFVals).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrSFVals).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete(string name, string descr, string pf) :
    FactoredDecPOMDPDiscreteInterface()
    ,MultiAgentDecisionProcessDiscreteFactoredStates(name, descr, pf)   
    ,_m_p_rModel()
    ,_m_cached_FlatRM(false)
    ,_m_sparse_FlatRM(false)
{
 }